

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

void __thiscall CombinePattern::restoreXml(CombinePattern *this,Element *el)

{
  ContextPattern *pCVar1;
  reference ppEVar2;
  InstructionPattern *pIVar3;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_28;
  const_iterator iter;
  List *list;
  Element *el_local;
  CombinePattern *this_local;
  
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_28);
  local_28._M_current =
       (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  pCVar1 = (ContextPattern *)operator_new(0x10);
  ContextPattern::ContextPattern(pCVar1);
  this->context = pCVar1;
  pCVar1 = this->context;
  ppEVar2 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_28);
  (*(pCVar1->super_DisjointPattern).super_Pattern._vptr_Pattern[0xe])(pCVar1,*ppEVar2);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_28);
  pIVar3 = (InstructionPattern *)operator_new(0x10);
  InstructionPattern::InstructionPattern(pIVar3);
  this->instr = pIVar3;
  pIVar3 = this->instr;
  ppEVar2 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_28);
  (*(pIVar3->super_DisjointPattern).super_Pattern._vptr_Pattern[0xe])(pIVar3,*ppEVar2);
  return;
}

Assistant:

void CombinePattern::restoreXml(const Element *el)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  context = new ContextPattern();
  context->restoreXml(*iter);
  ++iter;
  instr = new InstructionPattern();
  instr->restoreXml(*iter);
}